

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O1

LispPTR COM_finish_finfo(LispPTR *args)

{
  DFINFO *pDVar1;
  FINFO *pFVar2;
  finfo *pfVar3;
  int iVar4;
  LispPTR LVar5;
  uint uVar6;
  FINFO *pFVar7;
  
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar4 == 0) {
    Lisp_errno = &Dummy_errno;
    uVar6 = *args;
    if ((uVar6 & 0xfff0000) == 0xf0000) {
      uVar6 = uVar6 | 0xffff0000;
    }
    else if ((uVar6 & 0xfff0000) == 0xe0000) {
      uVar6 = uVar6 & 0xffff;
    }
    else {
      if ((uVar6 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
      }
      uVar6 = *(uint *)(Lisp_world + uVar6);
    }
    LVar5 = 0;
    if ((-1 < (int)uVar6) && ((int)uVar6 < MAXFINFO)) {
      pDVar1 = FinfoArray + uVar6;
      pFVar2 = FinfoArray[uVar6].head;
      if (pFVar2 == (FINFO *)0x0) {
        pDVar1->next = (FINFO *)0x0;
      }
      else {
        pDVar1->head = (FINFO *)0x0;
        pDVar1->next = (FINFO *)0x0;
        pfVar3 = pFVar2;
        do {
          pFVar7 = pfVar3;
          pfVar3 = pFVar7->next;
        } while (pfVar3 != (finfo *)0x0);
        pFVar7->next = FreeFinfoList;
        LVar5 = 0x4c;
        FreeFinfoList = pFVar2;
      }
    }
  }
  else {
    *Lisp_errno = 100;
    LVar5 = 0;
  }
  return LVar5;
}

Assistant:

LispPTR COM_finish_finfo(LispPTR *args)
{
  DFINFO *dfp;
  FINFO *fp;
  int finfoid;

  ERRSETJMP(NIL);

  Lisp_errno = &Dummy_errno;

  finfoid = LispNumToCInt(args[0]);

  if (finfoid < 0 || MAXFINFO - 1 < finfoid) return (NIL);

  dfp = &FinfoArray[finfoid];
  if ((fp = dfp->head) == (FINFO *)0) {
    dfp->next = (FINFO *)0;
    return (NIL);
  }

  dfp->head = (FINFO *)0;
  dfp->next = (FINFO *)0;
  FreeFinfo(fp);

  return (ATOM_T);
}